

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *in_RCX;
  VP8LBitEntropy *in_RDX;
  uint32_t in_ESI;
  int *in_RDI;
  float fVar1;
  uint32_t x;
  uint32_t x_prev;
  int i_prev;
  int i;
  int in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  int in_stack_fffffffffffffff0;
  
  uVar3 = 0;
  iVar2 = *in_RDI;
  memset(in_RCX,0,0x18);
  VP8LBitEntropyInit(in_RDX);
  for (iVar4 = 1; iVar4 < (int)in_ESI; iVar4 = iVar4 + 1) {
    in_stack_ffffffffffffffd0 = in_RDI[iVar4];
    if (in_stack_ffffffffffffffd0 != iVar2) {
      GetEntropyUnrefinedHelper
                (in_ESI,in_stack_fffffffffffffff0,(uint32_t *)in_RDX,in_RCX,
                 (VP8LBitEntropy *)CONCAT44(iVar4,uVar3),
                 (VP8LStreaks *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    }
  }
  GetEntropyUnrefinedHelper
            (in_ESI,in_stack_fffffffffffffff0,(uint32_t *)in_RDX,in_RCX,
             (VP8LBitEntropy *)CONCAT44(iVar4,uVar3),
             (VP8LStreaks *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  fVar1 = VP8LFastSLog2(0);
  in_RDX->entropy = (double)fVar1 + in_RDX->entropy;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(const uint32_t X[], int length,
                                  VP8LBitEntropy* const bit_entropy,
                                  VP8LStreaks* const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy += VP8LFastSLog2(bit_entropy->sum);
}